

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O3

uint duckdb::GetInternalCValue<unsigned_int,duckdb::TryCast>
               (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      uVar2 = TryCastCInternal<bool,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TINYINT:
      uVar2 = TryCastCInternal<signed_char,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_SMALLINT:
      uVar2 = TryCastCInternal<short,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_INTEGER:
      uVar2 = TryCastCInternal<int,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_BIGINT:
      uVar2 = TryCastCInternal<long,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UTINYINT:
      uVar2 = TryCastCInternal<unsigned_char,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_USMALLINT:
      uVar2 = TryCastCInternal<unsigned_short,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UINTEGER:
      uVar2 = TryCastCInternal<unsigned_int,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UBIGINT:
      uVar2 = TryCastCInternal<unsigned_long,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_FLOAT:
      uVar2 = TryCastCInternal<float,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DOUBLE:
      uVar2 = TryCastCInternal<double,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      uVar2 = TryCastCInternal<duckdb::timestamp_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DATE:
      uVar2 = TryCastCInternal<duckdb::date_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_TIME:
      uVar2 = TryCastCInternal<duckdb::dtime_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_INTERVAL:
      uVar2 = TryCastCInternal<duckdb::interval_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_HUGEINT:
      uVar2 = TryCastCInternal<duckdb::hugeint_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_VARCHAR:
      uVar2 = TryCastCInternal<char*,unsigned_int,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return uVar2;
    case DUCKDB_TYPE_DECIMAL:
      uVar2 = TryCastDecimalCInternal<unsigned_int>(result,col,row);
      return uVar2;
    case DUCKDB_TYPE_UHUGEINT:
      uVar2 = TryCastCInternal<duckdb::uhugeint_t,unsigned_int,duckdb::TryCast>(result,col,row);
      return uVar2;
    }
  }
  return 0;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}